

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O0

uint64_t FastSLog2Slow_C(uint32_t v)

{
  byte bVar1;
  int iVar2;
  uint in_EDI;
  double dVar3;
  uint32_t y;
  uint64_t log_cnt;
  uint64_t correction;
  uint64_t orig_v;
  ulong local_8;
  
  if (in_EDI < 0x10000) {
    iVar2 = BitsLog2Floor(in_EDI);
    bVar1 = (byte)(iVar2 + -7);
    local_8 = (ulong)in_EDI *
              ((ulong)kLog2Table[in_EDI >> (bVar1 & 0x1f)] + (long)(iVar2 + -7) * 0x800000) +
              (ulong)(in_EDI & (1 << (bVar1 & 0x1f)) - 1U) * 0xb8aa3b;
  }
  else {
    dVar3 = log((double)in_EDI);
    dVar3 = (double)in_EDI * 12102203.161561485 * dVar3 + 0.5;
    local_8 = (ulong)dVar3;
    local_8 = local_8 | (long)(dVar3 - 9.223372036854776e+18) & (long)local_8 >> 0x3f;
  }
  return local_8;
}

Assistant:

static uint64_t FastSLog2Slow_C(uint32_t v) {
  assert(v >= LOG_LOOKUP_IDX_MAX);
  if (v < APPROX_LOG_WITH_CORRECTION_MAX) {
    const uint64_t orig_v = v;
    uint64_t correction;
#if !defined(WEBP_HAVE_SLOW_CLZ_CTZ)
    // use clz if available
    const uint64_t log_cnt = BitsLog2Floor(v) - 7;
    const uint32_t y = 1 << log_cnt;
    v >>= log_cnt;
#else
    uint64_t log_cnt = 0;
    uint32_t y = 1;
    do {
      ++log_cnt;
      v = v >> 1;
      y = y << 1;
    } while (v >= LOG_LOOKUP_IDX_MAX);
#endif
    // vf = (2^log_cnt) * Xf; where y = 2^log_cnt and Xf < 256
    // Xf = floor(Xf) * (1 + (v % y) / v)
    // log2(Xf) = log2(floor(Xf)) + log2(1 + (v % y) / v)
    // The correction factor: log(1 + d) ~ d; for very small d values, so
    // log2(1 + (v % y) / v) ~ LOG_2_RECIPROCAL * (v % y)/v
    correction = LOG_2_RECIPROCAL_FIXED * (orig_v & (y - 1));
    return orig_v * (kLog2Table[v] + (log_cnt << LOG_2_PRECISION_BITS)) +
           correction;
  } else {
    return (uint64_t)(LOG_2_RECIPROCAL_FIXED_DOUBLE * v * log((double)v) + .5);
  }
}